

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  u8 i;
  long lVar1;
  short sVar2;
  Simd<unsigned_char,_(unsigned_char)__x10_> result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  local_28.v128_.v = (v128)Pop(this);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    sVar2 = *(short *)((long)&local_28 + lVar1 * 2);
    if (sVar2 < 1) {
      sVar2 = 0;
    }
    if (0xfe < sVar2) {
      sVar2 = 0xff;
    }
    *(char *)((long)&local_38 + lVar1) = (char)sVar2;
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    sVar2 = *(short *)((long)&local_18 + lVar1 * 2);
    if (sVar2 < 1) {
      sVar2 = 0;
    }
    if (0xfe < sVar2) {
      sVar2 = 0xff;
    }
    *(char *)((long)&local_38 + lVar1 + 8) = (char)sVar2;
  }
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}